

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sphere.cpp
# Opt level: O0

bool __thiscall phyr::Sphere::intersectRay(Sphere *this,Ray *ray,bool testAlpha)

{
  bool bVar1;
  byte in_DL;
  FPError *in_RDI;
  double dVar2;
  double dVar3;
  Point3f hpt;
  FPError t0;
  FPError t2;
  FPError t1;
  FPError c;
  FPError b;
  FPError a;
  FPError dz;
  FPError dy;
  FPError dx;
  FPError oz;
  FPError oy;
  FPError ox;
  Ray lr;
  Vector3f rdErr;
  Vector3f roErr;
  double in_stack_fffffffffffffbc0;
  double in_stack_fffffffffffffbc8;
  FPError *in_stack_fffffffffffffbd0;
  FPError *in_stack_fffffffffffffbd8;
  FPError *in_stack_fffffffffffffbe0;
  FPError *in_stack_fffffffffffffc08;
  Point3<double> local_3e8;
  double local_3c0;
  Vector3f *in_stack_fffffffffffffc48;
  Vector3f *in_stack_fffffffffffffc50;
  Ray *in_stack_fffffffffffffc58;
  Transform *in_stack_fffffffffffffc60;
  double local_390;
  FPError local_388 [4];
  FPError local_328;
  FPError local_310 [4];
  FPError *in_stack_fffffffffffffd50;
  FPError *in_stack_fffffffffffffd58;
  FPError in_stack_fffffffffffffd70;
  FPError in_stack_fffffffffffffd88;
  FPError in_stack_fffffffffffffda0;
  double local_238;
  Ray *local_230;
  Point3<double> *local_1a8;
  Point3<double> *local_120;
  double local_58;
  Vector3<double> local_50;
  Vector3<double> local_38;
  byte local_19;
  bool local_1;
  
  local_19 = in_DL & 1;
  Vector3<double>::Vector3(&local_38);
  Vector3<double>::Vector3(&local_50);
  Transform::operator()
            (in_stack_fffffffffffffc60,in_stack_fffffffffffffc58,in_stack_fffffffffffffc50,
             in_stack_fffffffffffffc48);
  FPError::FPError(in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0);
  FPError::FPError(in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0);
  FPError::FPError(in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0);
  FPError::FPError(in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0);
  FPError::FPError(in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0);
  FPError::FPError(in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0);
  FPError::operator*(in_RDI,in_stack_fffffffffffffc08);
  FPError::operator*(in_RDI,in_stack_fffffffffffffc08);
  FPError::operator+(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
  FPError::operator*(in_RDI,in_stack_fffffffffffffc08);
  FPError::operator+(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
  FPError::operator*(in_RDI,in_stack_fffffffffffffc08);
  FPError::operator*(in_RDI,in_stack_fffffffffffffc08);
  FPError::operator+(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
  FPError::operator*(in_RDI,in_stack_fffffffffffffc08);
  FPError::operator+(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
  phyr::operator*((double)in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
  FPError::operator*(in_RDI,in_stack_fffffffffffffc08);
  FPError::operator*(in_RDI,in_stack_fffffffffffffc08);
  FPError::operator+(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
  FPError::operator*(in_RDI,in_stack_fffffffffffffc08);
  FPError::operator+(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
  FPError::FPError(in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0);
  FPError::FPError(in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0);
  FPError::operator*(in_RDI,in_stack_fffffffffffffc08);
  FPError::operator-(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
  FPError::FPError(local_310);
  FPError::FPError(&local_328);
  bVar1 = solveQuadraticSystem
                    (in_stack_fffffffffffffd70,in_stack_fffffffffffffd88,in_stack_fffffffffffffda0,
                     in_stack_fffffffffffffd58,in_stack_fffffffffffffd50);
  if (bVar1) {
    dVar2 = FPError::upperBound(local_310);
    if ((local_58 < dVar2) || (dVar2 = FPError::lowerBound(&local_328), dVar2 <= 0.0)) {
      local_1 = false;
    }
    else {
      local_388[0].v = local_310[0].v;
      local_388[0].lBound = local_310[0].lBound;
      local_388[0].uBound = local_310[0].uBound;
      dVar2 = FPError::lowerBound(local_388);
      if (dVar2 <= 0.0) {
        local_388[0].v = local_328.v;
        local_388[0].lBound = local_328.lBound;
        local_388[0].uBound = local_328.uBound;
        dVar2 = FPError::upperBound(local_388);
        if (local_58 < dVar2) {
          return false;
        }
      }
      FPError::operator_cast_to_double(local_388);
      Ray::operator()(local_230,local_238);
      dVar2 = in_RDI[1].lBound;
      Point3<double>::Point3((Point3<double> *)&stack0xfffffffffffffc48,0.0,0.0,0.0);
      dVar3 = distance<double>(local_1a8,local_120);
      Point3<double>::operator*=((Point3<double> *)&stack0xfffffffffffffc60,dVar2 / dVar3);
      if (((-in_RDI[1].lBound < in_RDI[1].uBound) && (local_390 < in_RDI[1].uBound)) ||
         ((in_RDI[2].v < in_RDI[1].lBound && (in_RDI[2].v <= local_390 && local_390 != in_RDI[2].v))
         )) {
        bVar1 = FPError::operator==(local_388,&local_328);
        if (bVar1) {
          return false;
        }
        dVar2 = FPError::upperBound(local_388);
        if (local_58 < dVar2) {
          return false;
        }
        local_388[0].v = local_328.v;
        local_388[0].lBound = local_328.lBound;
        local_388[0].uBound = local_328.uBound;
        FPError::operator_cast_to_double(local_388);
        Ray::operator()(local_230,local_238);
        dVar2 = in_RDI[1].lBound;
        Point3<double>::Point3(&local_3e8,0.0,0.0,0.0);
        dVar3 = distance<double>(local_1a8,local_120);
        Point3<double>::operator*=((Point3<double> *)&stack0xfffffffffffffc60,dVar2 / dVar3);
        if (((-in_RDI[1].lBound < in_RDI[1].uBound) && (local_3c0 < in_RDI[1].uBound)) ||
           ((in_RDI[2].v < in_RDI[1].lBound &&
            (in_RDI[2].v <= local_3c0 && local_3c0 != in_RDI[2].v)))) {
          return false;
        }
      }
      local_1 = true;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool Sphere::intersectRay(const Ray& ray, bool testAlpha) const {
    Vector3f roErr, rdErr;
    // Transform ray to local space
    Ray lr = (*worldToLocal)(ray, &roErr, &rdErr);

    // Compute quadratic sphere coefficients
    FPError ox(lr.o.x, roErr.x), oy(lr.o.y, roErr.y), oz(lr.o.z, roErr.z);
    FPError dx(lr.d.x, rdErr.x), dy(lr.d.y, rdErr.y), dz(lr.d.z, rdErr.z);
    FPError a = dx * dx + dy * dy + dz * dz;
    FPError b = 2 * (ox * dx + oy * dy + oz * dz);
    FPError c = ox * ox + oy * oy + oz * oz - FPError(radius) * FPError(radius);

    // Solve quadratic equation for t
    FPError t1, t2;
    // No intersections
    if (!solveQuadraticSystem(a, b, c, &t1, &t2)) return false;

    // Check for trivial range exclusion
    if (t1.upperBound() > lr.tMax || t2.lowerBound() <= 0) return false;
    FPError t0 = t1;
    if (t0.lowerBound() <= 0) {
        t0 = t2; if (t0.upperBound() > lr.tMax) return false;
    }

    Point3f hpt = lr(Real(t0));
    // Reproject the point onto the surface to refine it
    hpt *= radius / distance(hpt, Point3f(0, 0, 0));

    if ((zMin > -radius && hpt.z < zMin) || (zMax < radius && hpt.z > zMax)) {
        // If ray origin is inside the sphere and t2 intersects a clipped region
        if (t0 == t2) return false;
        // We're looking at a hole in the sphere on the near side.
        // Test intersection with the farther side
        if (t0.upperBound() > lr.tMax) return false;

        // Test with t1 failed, try t2
        t0 = t2; hpt = lr(Real(t0));
        // Reproject the point onto the surface to refine it
        hpt *= radius / distance(hpt, Point3f(0, 0, 0));

        if ((zMin > -radius && hpt.z < zMin) || (zMax < radius && hpt.z > zMax))
            return false;
    }

    return true;
}